

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

string * __thiscall
AixLog::to_string_abi_cxx11_(string *__return_storage_ptr__,AixLog *this,Severity logSeverity)

{
  string *psVar1;
  string *extraout_RAX;
  char *pcVar2;
  char *pcVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Trace";
    pcVar2 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Debug";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Info";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Notice";
    pcVar2 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Warn";
    pcVar2 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Error";
    pcVar2 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Fatal";
    pcVar2 = "";
    break;
  default:
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::ostream::operator<<(local_188,(int)(char)((ulong)this & 0xffffffff));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_198);
    psVar1 = (string *)std::ios_base::~ios_base(local_118);
    return psVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return extraout_RAX;
}

Assistant:

static std::string to_string(Severity logSeverity) {
  switch (logSeverity) {
    case Severity::trace:
      return "Trace";
    case Severity::debug:
      return "Debug";
    case Severity::info:
      return "Info";
    case Severity::notice:
      return "Notice";
    case Severity::warning:
      return "Warn";
    case Severity::error:
      return "Error";
    case Severity::fatal:
      return "Fatal";
    default:
      std::stringstream ss;
      ss << static_cast<int>(logSeverity);
      return ss.str();
  }
}